

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

bool __thiscall
OSSLEDDSA::reconstructParameters
          (OSSLEDDSA *this,AsymmetricParameters **ppParams,ByteString *serialisedData)

{
  size_t sVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  ECParameters *params;
  ECParameters *in_stack_ffffffffffffffd0;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar1 = ByteString::size((ByteString *)0x1b6e25), sVar1 != 0)) {
    plVar2 = (long *)operator_new(0x30);
    plVar2[4] = 0;
    plVar2[5] = 0;
    plVar2[2] = 0;
    plVar2[3] = 0;
    *plVar2 = 0;
    plVar2[1] = 0;
    ECParameters::ECParameters(in_stack_ffffffffffffffd0);
    uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,in_RDX);
    if ((uVar3 & 1) == 0) {
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))();
      }
      return false;
    }
    *in_RSI = plVar2;
    return true;
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructParameters(AsymmetricParameters** ppParams, ByteString& serialisedData)
{
	// Check input parameters
	if ((ppParams == NULL) || (serialisedData.size() == 0))
	{
		return false;
	}

	ECParameters* params = new ECParameters();

	if (!params->deserialise(serialisedData))
	{
		delete params;

		return false;
	}

	*ppParams = params;

	return true;
}